

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

string * __thiscall
soul::ASTUtilities::
getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
          (string *__return_storage_ptr__,ASTUtilities *this,
          vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
          *params,ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args)

{
  long lVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  Constant *pCVar3;
  UsingDeclaration *pUVar4;
  Expression *pEVar5;
  NamespaceRef *pNVar6;
  VariableDeclaration *pVVar7;
  uint8_t *puVar8;
  ProcessorAliasDeclaration *pPVar9;
  NamespaceAliasDeclaration *pNVar10;
  void *o;
  void *extraout_RDX;
  void *o_00;
  void *extraout_RDX_00;
  void *o_01;
  pointer index;
  Namespace *this_00;
  LazyAllocatedData *this_01;
  undefined1 local_230 [8];
  pool_ptr<soul::AST::UsingDeclaration> u;
  Type targetType;
  pool_ref<soul::AST::ASTObject> local_200;
  pool_ref<soul::AST::Expression> local_1f8;
  pool_ref<soul::AST::ASTObject> local_1f0;
  pool_ref<soul::AST::ASTObject> local_1e8;
  string local_1e0;
  pool_ref<soul::AST::ASTObject> local_1c0;
  stringstream key;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&key);
  index = (pointer)0x0;
  do {
    lVar1 = *(long *)this;
    if ((pointer)(*(long *)(this + 8) - lVar1 >> 3) <= index) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&key);
      return __return_storage_ptr__;
    }
    if (index != (pointer)0x0) {
      std::operator<<(local_1a8,',');
    }
    local_1c0.object = *(ASTObject **)(lVar1 + (long)index * 8);
    cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>((soul *)&u,&local_1c0);
    if (u.object == (UsingDeclaration *)0x0) {
      local_1e8.object = *(ASTObject **)(lVar1 + (long)index * 8);
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&targetType,&local_1e8);
      if (CONCAT71(targetType._1_7_,targetType.category) == 0) {
        local_1f0.object = *(ASTObject **)(lVar1 + (long)index * 8);
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>
                  ((soul *)&targetType,&local_1f0);
        if (CONCAT71(targetType._1_7_,targetType.category) == 0) {
          local_200.object = *(ASTObject **)(lVar1 + (long)index * 8);
          cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>
                    ((soul *)&targetType,&local_200);
          if (CONCAT71(targetType._1_7_,targetType.category) == 0) {
            throwInternalCompilerError("getSpecialisationSignature",0xed);
          }
          pPVar9 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                             ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&targetType);
          getSignatureString_abi_cxx11_
                    (&local_1e0,(ASTUtilities *)(pPVar9->resolvedProcessor).object,o_00);
          std::operator<<(local_1a8,(string *)&local_1e0);
        }
        else {
          if (index < (params->
                      super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
            ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                               ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                 *)params,(size_t)index);
            local_1f8.object = ppVar2->object;
            cast<soul::AST::NamespaceRef,soul::AST::Expression>((soul *)&local_1e0,&local_1f8);
            pNVar6 = pool_ptr<soul::AST::NamespaceRef>::operator->
                               ((pool_ptr<soul::AST::NamespaceRef> *)&local_1e0);
            this_00 = pNVar6->ns;
            o_01 = extraout_RDX;
          }
          else {
            pNVar10 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->
                                ((pool_ptr<soul::AST::NamespaceAliasDeclaration> *)&targetType);
            this_00 = (pNVar10->resolvedNamespace).object;
            o_01 = extraout_RDX_00;
          }
          getSignatureString_abi_cxx11_(&local_1e0,(ASTUtilities *)this_00,o_01);
          std::operator<<(local_1a8,(string *)&local_1e0);
        }
      }
      else {
        if (index < (params->
                    super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
          ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                             ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                              params,(size_t)index);
          (*(ppVar2->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1e0);
          pCVar3 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&local_1e0);
        }
        else {
          pVVar7 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                             ((pool_ptr<soul::AST::VariableDeclaration> *)&targetType);
          pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pVVar7->initialValue);
          (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_1e0,pEVar5);
          pCVar3 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&local_1e0);
        }
        this_01 = &(pCVar3->value).allocatedData;
        puVar8 = soul::Value::LazyAllocatedData::data(this_01);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,puVar8,puVar8 + this_01->allocatedSize);
        std::operator<<(local_1a8,(string *)&local_1e0);
      }
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    else {
      if (index < (params->
                  super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
        ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                           ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                            params,(size_t)index);
        pEVar5 = ppVar2->object;
      }
      else {
        pUVar4 = pool_ptr<soul::AST::UsingDeclaration>::operator->(&u);
        pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pUVar4->targetType);
      }
      (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[5])(&targetType,pEVar5);
      if (targetType.category == structure) {
        Type::getStruct((Type *)local_230);
        getSignatureString_abi_cxx11_(&local_1e0,(ASTUtilities *)local_230,o);
        std::operator<<(local_1a8,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_230);
      }
      else {
        Type::getShortIdentifierDescription_abi_cxx11_(&local_1e0,&targetType);
        std::operator<<(local_1a8,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&targetType.structure);
    }
    index = (pointer)((long)&index->object + 1);
  } while( true );
}

Assistant:

static std::string getSpecialisationSignature (const ParamList& params, const ArgList& args)
    {
        std::stringstream key;

        for (size_t i = 0; i < params.size(); ++i)
        {
            auto& param = params[i];

            if (i > 0)
                key << ',';

            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                auto targetType = (i < args.size()) ? args[i]->resolveAsType() : u->targetType->resolveAsType();

                if (targetType.isStruct())
                    key << getSignatureString (targetType.getStruct().get());
                else
                    key << targetType.getShortIdentifierDescription();

                continue;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                auto& value = (i < args.size()) ?  args[i]->getAsConstant()->value : v->initialValue->getAsConstant()->value;
                key << std::string (static_cast<const char*> (value.getPackedData()), value.getPackedDataSize());
                continue;
            }

            if (auto v = cast<AST::NamespaceAliasDeclaration> (param))
            {
                auto ns = (i < args.size()) ? cast<AST::NamespaceRef> (args[i])->ns : v->resolvedNamespace;
                key << getSignatureString (ns.get());
                continue;
            }

            if (auto v = cast<AST::ProcessorAliasDeclaration> (param))
            {
                key << getSignatureString (v->resolvedProcessor.get());
                continue;
            }

            SOUL_ASSERT_FALSE;
        }

        return key.str();
    }